

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O2

S2LatLng s2textformat::MakeLatLngOrDie(string_view str)

{
  R2Point RVar1;
  bool bVar2;
  ostream *poVar3;
  absl *this;
  S2LatLng *in_RCX;
  size_type sVar4;
  string_view str_00;
  string_view piece;
  S2LatLng latlng;
  S2LogMessage local_28;
  
  str_00.ptr_ = (char *)str.length_;
  latlng.coords_.c_[0] = 0.0;
  latlng.coords_.c_[1] = 0.0;
  str_00.length_ = (size_type)&latlng;
  bVar2 = MakeLatLng((s2textformat *)str.ptr_,str_00,in_RCX);
  if (bVar2) {
    RVar1.c_[1] = latlng.coords_.c_[1];
    RVar1.c_[0] = latlng.coords_.c_[0];
    return (R2Point)(R2Point)RVar1.c_;
  }
  sVar4 = 3;
  S2LogMessage::S2LogMessage
            (&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
             ,0x74,kFatal,(ostream *)&std::cerr);
  poVar3 = std::operator<<(local_28.stream_,"Check failed: MakeLatLng(str, &latlng) ");
  this = (absl *)std::operator<<(poVar3,": str == \"");
  piece.length_ = sVar4;
  piece.ptr_ = str_00.ptr_;
  poVar3 = absl::operator<<(this,(ostream *)str.ptr_,piece);
  std::operator<<(poVar3,"\"");
  abort();
}

Assistant:

S2LatLng MakeLatLngOrDie(string_view str) {
  S2LatLng latlng;
  S2_CHECK(MakeLatLng(str, &latlng)) << ": str == \"" << str << "\"";
  return latlng;
}